

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_conv.cpp
# Opt level: O3

pair<std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>,_std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>_>
* __thiscall
LayerConv::convolution
          (pair<std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>,_std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>_>
           *__return_storage_ptr__,LayerConv *this,ImageVolume *input)

{
  int p;
  int s;
  pointer pMVar1;
  size_t f;
  pointer pvVar2;
  LayerConv *pLVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ImageVolume output_z;
  ImageVolume output_a;
  MatrixXd conv_mat;
  MatrixXd filters_mat;
  MatrixXd input_mat;
  undefined1 local_e8 [24];
  element_type *local_d0;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  ImageVolume *local_c0;
  ImageVolume local_b8;
  MatrixXd local_a0;
  MatrixXd local_88;
  MatrixXd local_70;
  double local_58;
  double dStack_50;
  LayerSize local_48;
  
  pvVar2 = (input->
           super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((input->
      super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pvVar2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"convolution",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,":: fatal error: ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"empty input is not allowed!",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    (__return_storage_ptr__->first).
    super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->first).
    super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &(__return_storage_ptr__->first).
      super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    (__return_storage_ptr__->second).
    super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->second).
    super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_c0 = &this->__filters;
    pLVar3 = this;
    local_d0 = (element_type *)__return_storage_ptr__;
    if ((this->__filters).
        super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->__filters).
        super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pLVar3 = (LayerConv *)
               (((long)(pvVar2->
                       super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar2->
                       super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
      init_filters(this,(size_t)pLVar3);
      pvVar2 = (input->
               super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    local_48.channels = (int)this->__num_filters;
    pMVar1 = (pvVar2->
             super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    p = (this->super_LayerBase)._padding;
    s = (this->super_LayerBase)._stride;
    dVar7 = (double)p;
    f = this->__filter_size;
    auVar9._8_4_ = (int)(f >> 0x20);
    auVar9._0_8_ = f;
    auVar9._12_4_ = 0x45300000;
    dVar4 = (double)CONCAT44(0x43300000,(int)f) - 4503599627370496.0;
    dVar5 = auVar9._8_8_ - 1.9342813113834067e+25;
    auVar6._0_8_ = (double)s;
    dVar7 = dVar7 + dVar7;
    auVar8._0_8_ = (dVar7 + (double)(pMVar1->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    ).m_storage.m_rows) - (dVar5 + dVar4);
    auVar8._8_8_ = (dVar7 + (double)(pMVar1->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    ).m_storage.m_cols) - (dVar5 + dVar4);
    auVar6._8_8_ = auVar6._0_8_;
    auVar9 = divpd(auVar8,auVar6);
    local_58 = auVar9._0_8_ + 1.0;
    dStack_50 = auVar9._8_8_ + 1.0;
    local_c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)floor(dStack_50);
    dVar4 = floor(local_58);
    local_48.rows = (Index)dVar4;
    local_48.cols = (Index)(double)local_c8._M_pi;
    img2mat(&local_70,pLVar3,input,&local_48,f,p,s);
    filters2mat(&local_88,pLVar3,local_c0,false);
    if (local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
        != local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows) {
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/Product.h"
                    ,0x61,
                    "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
                   );
    }
    local_e8._0_8_ = &local_70;
    local_e8._8_8_ = &local_88;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a0,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                *)local_e8);
    local_e8._0_8_ = &this->__baises;
    pLVar3 = (LayerConv *)local_e8;
    local_b8.
    super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_a0;
    Eigen::VectorwiseOp<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::operator+=
              ((VectorwiseOp<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *)&local_b8,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)pLVar3);
    mat2img((ImageVolume *)local_e8,pLVar3,&local_a0,&local_48);
    __return_storage_ptr__ =
         (pair<std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>,_std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>_>
          *)local_d0;
    apply_activation(&local_b8,pLVar3,(ImageVolume *)local_e8);
    std::
    pair<std::vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>,_std::vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>_>
    ::
    pair<std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>_&,_std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>_&,_true>
              (__return_storage_ptr__,
               (vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                *)local_e8,&local_b8);
    std::
    vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
    ::~vector(&local_b8);
    std::
    vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
    ::~vector((vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
               *)local_e8);
    free(local_a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
    ;
    free(local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
    ;
    free(local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
    ;
  }
  return (pair<std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>,_std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>_>
          *)(element_type *)__return_storage_ptr__;
}

Assistant:

pair< ImageVolume, ImageVolume > LayerConv::convolution(const ImageVolume& input) {
	if (input.size() <= 0) {
		cout << __FUNCTION__ << ":: fatal error: " << "empty input is not allowed!" << endl;
		return pair< ImageVolume, ImageVolume >();
	}
	auto channels = input[0].size(); // filter channels number

	if (__filters.size() <= 0) init_filters(channels);

	LayerSize output_size;
	output_size.channels = __num_filters;
	output_size.rows = static_cast<Index>(floor((input[0][0].rows() + 2.0 * _padding - __filter_size) / (1.0 * _stride) + 1));
	output_size.cols = static_cast<Index>(floor((input[0][0].cols() + 2.0 * _padding - __filter_size) / (1.0 * _stride) + 1));

	auto input_mat = img2mat(input, output_size, __filter_size, _padding, _stride);
	auto filters_mat = filters2mat(__filters);

	MatrixXd conv_mat = input_mat * filters_mat;
	conv_mat.rowwise() += __baises.transpose();
	auto output_z = mat2img(conv_mat, output_size);
	auto output_a = apply_activation(output_z);

	return make_pair(output_z, output_a);
}